

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestUploadCommand::Clone(cmCTestUploadCommand *this)

{
  cmCTestScriptHandler *pcVar1;
  cmCTestHandlerCommand *this_00;
  cmMakefile **ppcVar2;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xd8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestUploadCommand_00780ee8;
  ppcVar2 = &this_00[1].super_cmCTestCommand.super_cmCommand.Makefile;
  *(undefined4 *)&this_00[1].super_cmCTestCommand.super_cmCommand.Makefile = 0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_dataplus._M_p = (pointer)0x0;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error._M_string_length = (size_type)ppcVar2;
  this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2._M_allocated_capacity =
       (size_type)ppcVar2;
  *(undefined8 *)((long)&this_00[1].super_cmCTestCommand.super_cmCommand.Error.field_2 + 8) = 0;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler = pcVar1;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestUploadCommand* ni = new cmCTestUploadCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }